

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::PlainGatherIntCubeArray::Verify(PlainGatherIntCubeArray *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  Vector<int,_4> local_38;
  undefined1 local_28 [8];
  IVec4 data;
  PlainGatherIntCubeArray *this_local;
  
  data.m_data._8_8_ = this;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_28);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,1,1,0x8d99,0x1404,local_28);
  tcu::Vector<int,_4>::Vector(&local_38,0,4,8,0xc);
  bVar4 = tcu::Vector<int,_4>::operator!=((Vector<int,_4> *)local_28,&local_38);
  if (bVar4) {
    puVar5 = (uint *)tcu::Vector<int,_4>::x((Vector<int,_4> *)local_28);
    uVar1 = *puVar5;
    puVar5 = (uint *)tcu::Vector<int,_4>::y((Vector<int,_4> *)local_28);
    uVar2 = *puVar5;
    puVar5 = (uint *)tcu::Vector<int,_4>::z((Vector<int,_4> *)local_28);
    uVar3 = *puVar5;
    puVar5 = (uint *)tcu::Vector<int,_4>::w((Vector<int,_4> *)local_28);
    anon_unknown_0::Output
              ("Expected 0, 4, 8, 12, got: %d, %d, %d, %d",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
               (ulong)*puVar5);
    this_local = (PlainGatherIntCubeArray *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (PlainGatherIntCubeArray *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long Verify()
	{
		IVec4 data;
		glReadPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_INT, &data);
		if (data != IVec4(0, 4, 8, 12))
		{
			Output("Expected 0, 4, 8, 12, got: %d, %d, %d, %d", data.x(), data.y(), data.z(), data.w());
			return ERROR;
		}
		return NO_ERROR;
	}